

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu540c_common.c
# Opt level: O1

MPP_RET vepu540c_set_roi(void *roi_reg_base,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  MppEncROIRegion *pMVar1;
  undefined4 in_register_0000000c;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pMVar1 = roi->regions;
  *(undefined8 *)((long)roi_reg_base + 0x80) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x88) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x70) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x78) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x60) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x68) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x50) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x58) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x40) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x48) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x30) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x38) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x20) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x28) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x10) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x18) = 0;
  if (roi_reg_base == (void *)0x0 || roi == (MppEncROICfg *)0x0) {
    _mpp_log_l(2,"vepu540c_common","invalid buf %p roi %p\n","vepu540c_set_roi",roi_reg_base);
  }
  else {
    if (roi->number < 9) {
      if (0 < (int)roi->number) {
        lVar2 = 0;
        iVar3 = 0;
        do {
          uVar5 = (uint)*(ushort *)((long)&pMVar1->x + lVar2);
          if ((w < (int)(*(ushort *)((long)&pMVar1->w + lVar2) + uVar5)) ||
             (iVar4 = 0,
             h < (int)((uint)*(ushort *)((long)&pMVar1->h + lVar2) +
                      (uint)*(ushort *)((long)&pMVar1->y + lVar2)))) {
            iVar4 = -1;
          }
          if ((((1 < *(ushort *)((long)&pMVar1->intra + lVar2)) ||
               (7 < *(ushort *)((long)&pMVar1->qp_area_idx + lVar2))) ||
              (1 < (&pMVar1->area_map_en)[lVar2])) || (1 < (&pMVar1->abs_qp_en)[lVar2])) {
            iVar4 = -1;
          }
          if ((&pMVar1->abs_qp_en)[lVar2] == '\0') {
LAB_00267da0:
            if ((ushort)(*(short *)((long)&pMVar1->quality + lVar2) - 0x34U) < 0xff99) {
LAB_00267db1:
              iVar4 = -1;
            }
          }
          else {
            if (0x33 < *(short *)((long)&pMVar1->quality + lVar2)) goto LAB_00267db1;
            if ((&pMVar1->abs_qp_en)[lVar2] == '\0') goto LAB_00267da0;
          }
          if (iVar4 != 0) {
            _mpp_log_l(2,"vepu540c_common","region %d invalid param:\n","vepu540c_set_roi");
            _mpp_log_l(2,"vepu540c_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu540c_set_roi",
                       (ulong)*(ushort *)((long)&pMVar1->x + lVar2),
                       (ulong)*(ushort *)((long)&pMVar1->y + lVar2),
                       (ulong)*(ushort *)((long)&pMVar1->w + lVar2),
                       (ulong)*(ushort *)((long)&pMVar1->h + lVar2),(ulong)(uint)w,
                       CONCAT44(in_register_0000000c,h));
            _mpp_log_l(2,"vepu540c_common","force intra %d qp area index %d\n","vepu540c_set_roi",
                       (ulong)*(ushort *)((long)&pMVar1->intra + lVar2),
                       (ulong)*(ushort *)((long)&pMVar1->qp_area_idx + lVar2));
            _mpp_log_l(2,"vepu540c_common","abs qp mode %d value %d\n","vepu540c_set_roi",
                       (ulong)(&pMVar1->abs_qp_en)[lVar2],
                       (ulong)(uint)(int)*(short *)((long)&pMVar1->quality + lVar2));
            return MPP_NOK;
          }
          uVar6 = uVar5 + 0xf >> 4 & 0x3ff;
          uVar5 = *(uint *)((long)roi_reg_base + lVar2 + 0x10);
          *(uint *)((long)roi_reg_base + lVar2 + 0x10) = uVar5 & 0xfffffc00 | uVar6;
          *(uint *)((long)roi_reg_base + lVar2 + 0x10) =
               uVar5 & 0xfc00fc00 | uVar6 |
               (uint)*(ushort *)((long)&pMVar1->y + lVar2) * 0x1000 + 0xf000 & 0x3ff0000;
          uVar6 = (uint)*(ushort *)((long)&pMVar1->x + lVar2) +
                  (uint)*(ushort *)((long)&pMVar1->w + lVar2) + 0xf >> 4 & 0x3ff;
          uVar5 = *(uint *)((long)roi_reg_base + lVar2 + 0x14);
          *(uint *)((long)roi_reg_base + lVar2 + 0x14) = uVar5 & 0xfffffc00 | uVar6;
          *(uint *)((long)roi_reg_base + lVar2 + 0x14) =
               uVar5 & 0xfc00fc00 | uVar6 |
               ((uint)*(ushort *)((long)&pMVar1->h + lVar2) +
               (uint)*(ushort *)((long)&pMVar1->y + lVar2)) * 0x1000 + 0xf000 & 0x3ff0000;
          uVar5 = *(uint *)((long)roi_reg_base + lVar2 + 0x18);
          uVar6 = *(ushort *)((long)&pMVar1->quality + lVar2) & 0x7f;
          *(uint *)((long)roi_reg_base + lVar2 + 0x18) = uVar5 & 0xffffff80 | uVar6;
          *(uint *)((long)roi_reg_base + lVar2 + 0x18) =
               (uint)(byte)((&pMVar1->abs_qp_en)[lVar2] << 7) + (uVar5 & 0xffffc000 | uVar6) +
               0x3f00;
          if (*(short *)((long)&pMVar1->intra + lVar2) != 0) {
            *(uint *)((long)roi_reg_base + lVar2 + 0x1c) =
                 *(uint *)((long)roi_reg_base + lVar2 + 0x1c) & 0xff0ff0ff | 0x100100;
          }
          iVar3 = iVar3 + 1;
          lVar2 = lVar2 + 0x10;
        } while (iVar3 < (int)roi->number);
      }
      return MPP_OK;
    }
    _mpp_log_l(2,"vepu540c_common","invalid region number %d\n","vepu540c_set_roi");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu540c_set_roi(void *roi_reg_base, MppEncROICfg * roi,
                         RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu540cRoiCfg  *roi_cfg = (Vepu540cRoiCfg *)roi_reg_base;
    Vepu540cRoiRegion *reg_regions = &roi_cfg->regions[0];
    MPP_RET ret = MPP_NOK;
    RK_S32 i = 0;
    memset(reg_regions, 0, sizeof(Vepu540cRoiRegion) * 8);
    if (NULL == roi_cfg || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", roi_cfg, roi);
        goto DONE;
    }

    if (roi->number > VEPU540C_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32) roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1
            || region->qp_area_idx >= VEPU541_MAX_ROI_NUM
            || region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en
             && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w,
                      h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
        reg_regions->roi_pos_lt.roi_lt_x = MPP_ALIGN(region->x, 16) >> 4;
        reg_regions->roi_pos_lt.roi_lt_y = MPP_ALIGN(region->y, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_x = MPP_ALIGN(region->x + region->w, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_y = MPP_ALIGN(region->y + region->h, 16) >> 4;
        reg_regions->roi_base.roi_qp_value = region->quality;
        reg_regions->roi_base.roi_qp_adj_mode = region->abs_qp_en;
        reg_regions->roi_base.roi_en = 1;
        reg_regions->roi_base.roi_pri = 0x1f;
        if (region->intra) {
            reg_regions->roi_mdc.roi_mdc_intra16 = 1;
            reg_regions->roi_mdc.roi0_mdc_intra32_hevc = 1;
        }
        reg_regions++;
    }

DONE:
    return ret;
}